

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

bool InitEthernet(AmpIO *Board,uint eth_port)

{
  uint8_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  ostream *poVar6;
  char *pcVar7;
  uint32_t status;
  uint16_t regHigh;
  uint16_t regMid;
  uint16_t regLow;
  
  uVar4 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  if (uVar4 < 5) {
    poVar6 = std::operator<<((ostream *)&std::cout,"   No Ethernet controller, firmware version = ")
    ;
    BoardIO::GetFirmwareVersion((BoardIO *)Board);
  }
  else {
    uVar5 = BoardIO::GetFpgaVersionMajor((BoardIO *)Board);
    if (1 < uVar5) {
      PrintEthernetStatus(Board);
      FpgaIO::WriteEthernetPhyReset(&Board->super_FpgaIO,eth_port);
      Amp1394_Sleep(*(double *)(&DAT_00119040 + (ulong)(uVar5 == 2) * 8));
      FpgaIO::ReadEthernetStatus(&Board->super_FpgaIO,&status);
      poVar6 = std::operator<<((ostream *)&std::cout,"   After reset, status = ");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      if (uVar5 == 2) {
        if ((status & 0x20000000) == 0) {
          pcVar7 = "   Ethernet V2 failed initialization";
LAB_00105d6b:
          poVar6 = std::operator<<((ostream *)&std::cout,pcVar7);
          std::endl<char,std::char_traits<char>>(poVar6);
          EthBasePort::PrintStatus((ostream *)&std::cout,status);
          return false;
        }
        uVar3 = FpgaIO::ReadKSZ8851ChipID(&Board->super_FpgaIO);
        poVar6 = std::operator<<((ostream *)&std::cout,"   Chip ID = ");
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
        std::endl<char,std::char_traits<char>>(poVar6);
        if ((uVar3 & 0xfff0) != 0x8870) {
          return false;
        }
        bVar2 = CheckEthernetV2(Board);
        if (!bVar2) {
LAB_00105ec1:
          PrintEthernetStatus(Board);
          return false;
        }
        FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x10',&regLow);
        FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x12',&regMid);
        FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x14',&regHigh);
        poVar6 = std::operator<<((ostream *)&std::cout,"   MAC address = ");
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,regHigh);
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,regMid);
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,regLow);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else if (uVar5 == 3) {
        uVar1 = FpgaIO::GetEthernetPortStatusV3(status,eth_port);
        if (-1 < (char)uVar1) {
          pcVar7 = "   Ethernet V3 failed initialization";
          goto LAB_00105d6b;
        }
        bVar2 = CheckEthernetV3(Board,eth_port);
        if (!bVar2) goto LAB_00105ec1;
      }
      Amp1394_Sleep(2.5);
      return true;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"   No Ethernet in FPGA V");
  }
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  return false;
}

Assistant:

bool InitEthernet(AmpIO &Board, unsigned int eth_port)
{
    if (Board.GetFirmwareVersion() < 5) {
        std::cout << "   No Ethernet controller, firmware version = " << Board.GetFirmwareVersion() << std::endl;
        return false;
    }

    unsigned int fpga_ver = Board.GetFpgaVersionMajor();
    if (fpga_ver < 2) {
        std::cout << "   No Ethernet in FPGA V" << fpga_ver << std::endl;
        return false;
    }
    PrintEthernetStatus(Board);

    // Reset the board
    Board.WriteEthernetPhyReset(eth_port);
    if (fpga_ver == 2) {
        // Wait 100 msec
        Amp1394_Sleep(0.1);
    }
    else {
        // Wait 500 msec
        Amp1394_Sleep(0.5);
    }

    // Read the status
    uint32_t status;
    Board.ReadEthernetStatus(status);
    std::cout << "   After reset, status = " << std::hex << ((fpga_ver == 2) ? (status>>16) : status) << std::endl;

    if (fpga_ver == 2) {
        if (!(status & FpgaIO::ETH_STAT_INIT_OK_V2)) {
            std::cout << "   Ethernet V2 failed initialization" << std::endl;
            EthBasePort::PrintStatus(std::cout, status);
            return false;
        }

        // Read the Chip ID (16-bit read)
        uint16_t chipID = Board.ReadKSZ8851ChipID();
        std::cout << "   Chip ID = " << std::hex << chipID << std::endl;
        if ((chipID&0xfff0) != 0x8870)
            return false;


        // Check that KSZ8851 registers are as expected
        if (!CheckEthernetV2(Board)) {
            PrintEthernetStatus(Board);
            return false;
        }

        // Display the MAC address
        uint16_t regLow, regMid, regHigh;
        Board.ReadKSZ8851Reg(0x10, regLow);   // MAC address low = 0x94nn (nn = board id)
        Board.ReadKSZ8851Reg(0x12, regMid);   // MAC address middle = 0xOE13
        Board.ReadKSZ8851Reg(0x14, regHigh);  // MAC address high = 0xFA61
        std::cout << "   MAC address = " << std::hex << regHigh << ":" << regMid << ":" << regLow << std::endl;
    }
    else if (fpga_ver == 3) {
        uint8_t portStatus = FpgaIO::GetEthernetPortStatusV3(status, eth_port);
        if (!(portStatus & FpgaIO::ETH_PORT_STAT_INIT_OK)) {
            std::cout << "   Ethernet V3 failed initialization" << std::endl;
            EthBasePort::PrintStatus(std::cout, status);
            return false;
        }

        // Check that RTL8211F registers are as expected
        if (!CheckEthernetV3(Board, eth_port)) {
            PrintEthernetStatus(Board);
            return false;
        }
    }

    // Wait 2.5 sec
    Amp1394_Sleep(2.5);
    return true;
}